

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::safe_strtod(char *str,double *value)

{
  byte *pbVar1;
  byte *in_RAX;
  bool bVar2;
  double dVar3;
  byte *local_28;
  char *endptr;
  
  local_28 = in_RAX;
  dVar3 = internal::NoLocaleStrtod(str,(char **)&local_28);
  *value = dVar3;
  pbVar1 = local_28;
  if (local_28 != (byte *)str) {
    do {
      do {
        local_28 = pbVar1;
        pbVar1 = local_28 + 1;
      } while (*local_28 - 9 < 5);
    } while (*local_28 == 0x20);
  }
  if (*str == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = *local_28 == 0;
  }
  return bVar2;
}

Assistant:

bool safe_strtod(const char* str, double* value) {
  char* endptr;
  *value = internal::NoLocaleStrtod(str, &endptr);
  if (endptr != str) {
    while (ascii_isspace(*endptr)) ++endptr;
  }
  // Ignore range errors from strtod.  The values it
  // returns on underflow and overflow are the right
  // fallback in a robust setting.
  return *str != '\0' && *endptr == '\0';
}